

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

void __thiscall TidyConfigParser::reportErrorAndExit(TidyConfigParser *this,string *str)

{
  string_view text;
  long in_RDI;
  undefined1 in_stack_00000110 [16];
  undefined1 in_stack_00000120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  value<fmt::v11::context> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  __sv_type local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8 [2];
  undefined8 local_c8 [4];
  undefined8 local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 *local_78;
  long local_70;
  char *local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_70 = in_RDI + 0x40;
  local_78 = (undefined8 *)(in_RDI + 0x1e8);
  local_80 = (undefined8 *)(in_RDI + 0x1f0);
  this_00 = &local_128;
  local_68 = "Error while parsing slang-tidy config: {} {}:{}\n\t{}\n";
  uStack_60 = 0x34;
  local_98 = "Error while parsing slang-tidy config: {} {}:{}\n\t{}\n";
  uStack_90 = 0x34;
  local_58 = this_00;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_38 = local_d8;
  local_40 = *local_78;
  local_48 = local_c8;
  local_50 = *local_80;
  local_30 = local_40;
  local_28 = local_38;
  local_20 = local_50;
  local_18 = local_48;
  local_d8[0] = local_40;
  local_c8[0] = local_50;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_8 = &local_a8;
  local_a8 = 0xd44d;
  local_10 = local_e8;
  local_a0 = local_e8;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000120,(format_args)in_stack_00000110);
  local_108 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  text._M_str = (char *)in_stack_fffffffffffffec0;
  text._M_len = (size_t)in_stack_fffffffffffffeb8;
  slang::OS::printE(text);
  std::__cxx11::string::~string(this_00);
  exit(1);
}

Assistant:

void TidyConfigParser::reportErrorAndExit(const std::string& str) const {
    slang::OS::printE(fmt::format("Error while parsing slang-tidy config: {} "
                                  "{}:{}\n\t{}\n",
                                  filePath, line, col, str));
    exit(1);
}